

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

string * __thiscall
deqp::gls::DrawTestSpec::inputTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestSpec *this,InputType type)

{
  char *__s;
  char **ppcVar1;
  allocator<char> local_15;
  Type_conflict local_14;
  string *psStack_10;
  InputType type_local;
  
  local_14 = (Type_conflict)this;
  psStack_10 = __return_storage_ptr__;
  ppcVar1 = de::getSizedArrayElement<12,12,char_const*>(&inputTypeToString::types,local_14);
  __s = *ppcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_15)
  ;
  std::allocator<char>::~allocator(&local_15);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawTestSpec::inputTypeToString(InputType type)
{
	static const char* types[] =
	{
		"float",			// INPUTTYPE_FLOAT = 0,
		"fixed",			// INPUTTYPE_FIXED,
		"double",			// INPUTTYPE_DOUBLE

		"byte",				// INPUTTYPE_BYTE,
		"short",			// INPUTTYPE_SHORT,

		"unsigned_byte",	// INPUTTYPE_UNSIGNED_BYTE,
		"unsigned_short",	// INPUTTYPE_UNSIGNED_SHORT,

		"int",						// INPUTTYPE_INT,
		"unsigned_int",				// INPUTTYPE_UNSIGNED_INT,
		"half",						// INPUTTYPE_HALF,
		"unsigned_int2_10_10_10",	// INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		"int2_10_10_10"				// INPUTTYPE_INT_2_10_10_10,
	};

	return de::getSizedArrayElement<DrawTestSpec::INPUTTYPE_LAST>(types, (int)type);
}